

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O1

boolean write_level_file(char *filename,sp_lev *lvl)

{
  long *__buf;
  ulong *puVar1;
  char cVar2;
  byte bVar3;
  opvar *poVar4;
  byte *pbVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ssize_t sVar10;
  ulong uVar11;
  char *__format;
  char *pcVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  char lbuf [60];
  _opcode tmpo;
  long in_stack_fffffffffffffec8;
  uint uVar16;
  int local_104;
  char *local_100;
  char local_f8 [4];
  undefined1 auStack_f4 [4];
  undefined1 auStack_f0 [56];
  ulong local_b8;
  byte *pbStack_b0;
  
  if (decompile != 0) {
    local_f8[0] = '\0';
    strcat(local_f8,outprefix);
    strcat(local_f8,filename);
    sVar7 = strlen(local_f8);
    builtin_strncpy(local_f8 + sVar7,"_lev.txt",8);
    auStack_f0[sVar7] = 0;
    iVar6 = open(local_f8,0x241,0x1a4);
    if (iVar6 < 0) {
      return '\0';
    }
    local_100 = filename;
    if (0 < lvl->n_opcodes) {
      lVar14 = 0;
      do {
        uVar16 = lvl->opcodes[lVar14].opcode;
        poVar4 = lvl->opcodes[lVar14].opdat;
        if (0x4b < (ulong)(long)(int)uVar16) {
          panic("decompile_maze: unknown opcode (%i).",(ulong)uVar16);
        }
        if (uVar16 != 0x28) {
          if (poVar4 != (opvar *)0x0) {
            panic("decompile_maze: opcode (%i) has data.",(ulong)uVar16);
          }
          snprintf((char *)&local_b8,0x7f,"%li:\t%s\n",lVar14,
                   &DAT_00116150 + *(int *)(&DAT_00116150 + (long)(int)uVar16 * 4));
          goto LAB_0010dbf1;
        }
        if (poVar4 == (opvar *)0x0) {
          panic("decompile_maze: PUSH with no data.");
        }
        cVar2 = poVar4->spovartyp;
        uVar16 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
        switch(cVar2) {
        case '\0':
          goto switchD_0010d931_caseD_0;
        case '\x01':
          pcVar12 = (poVar4->vardata).str;
          if (pcVar12 + -0x20 < (char *)0x5f) {
            in_stack_fffffffffffffec8 = (ulong)uVar16 << 0x20;
            __format = "%li:\t%s\tint:%li\t# \'%c\'\n";
          }
          else {
            __format = "%li:\t%s\tint:%li\n";
          }
          break;
        case '\x02':
        case '\x03':
          pcVar12 = (poVar4->vardata).str;
          if (pcVar12 == (char *)0x0) {
            sVar7 = 0;
          }
          else {
            sVar7 = strlen(pcVar12);
          }
          iVar13 = (int)sVar7;
          if (iVar13 == 0) goto switchD_0010d931_caseD_0;
          if (iVar13 < 0x80) {
            if (0 < iVar13) {
              uVar11 = 0;
              do {
                if ((byte)(pcVar12[uVar11] + 0x81U) < 0xa1) goto LAB_0010db24;
                uVar11 = uVar11 + 1;
              } while ((sVar7 & 0xffffffff) != uVar11);
            }
            __format = "%li:\t%s\tstr:\"%s\"\n";
            if (cVar2 == '\x03') {
              __format = "%li:\t%s\tvar:$%s\n";
            }
            break;
          }
LAB_0010db24:
          snprintf((char *)&local_b8,0x7f,"%li:\t%s\tstr:",lVar14,"push");
          sVar9 = strlen((char *)&local_b8);
          sVar9 = write(iVar6,&local_b8,sVar9);
          sVar8 = strlen((char *)&local_b8);
          if (sVar9 == sVar8) {
            if (0 < iVar13) {
              uVar11 = 0;
              do {
                snprintf((char *)&local_b8,0x7f,"%02x ",
                         (ulong)(uint)(int)(poVar4->vardata).str[uVar11]);
                sVar9 = strlen((char *)&local_b8);
                sVar9 = write(iVar6,&local_b8,sVar9);
                sVar8 = strlen((char *)&local_b8);
                if (sVar9 != sVar8) goto LAB_0010dc2a;
                uVar11 = uVar11 + 1;
              } while ((sVar7 & 0xffffffff) != uVar11);
            }
            local_b8 = CONCAT62(local_b8._2_6_,10);
            goto LAB_0010dbf1;
          }
          goto LAB_0010dc2a;
        case '\x04':
          pcVar12 = (char *)((poVar4->vardata).l & 0xff);
          in_stack_fffffffffffffec8 = 0;
          __format = "%li:\t%s\tcoord:(%li,%li)\n";
          break;
        case '\x05':
          pcVar12 = (char *)((poVar4->vardata).l & 0xff);
          in_stack_fffffffffffffec8 = 0;
          __format = "%li:\t%s\tregion:(%li,%li,%li,%li)\n";
          break;
        case '\x06':
          in_stack_fffffffffffffec8 = CONCAT44(uVar16,(int)(char)(*(uint *)&poVar4->vardata >> 8));
          snprintf((char *)&local_b8,0x7f,"%li:\t%s\tmapchar:(%i,%i)\n",lVar14,"push",
                   (ulong)(*(uint *)&poVar4->vardata & 0xff),in_stack_fffffffffffffec8);
          goto LAB_0010dbf1;
        case '\a':
          pcVar12 = (char *)(ulong)(*(uint *)&poVar4->vardata >> 8 & 0xffff);
          in_stack_fffffffffffffec8 = (ulong)uVar16 << 0x20;
          __format = "%li:\t%s\tmonst:(pm=%li,class=\'%c\')\n";
          break;
        case '\b':
          pcVar12 = (char *)(ulong)(*(uint *)&poVar4->vardata >> 8 & 0xffff);
          in_stack_fffffffffffffec8 = (ulong)uVar16 << 0x20;
          __format = "%li:\t%s\tobj:(id=%li,class=\'%c\')\n";
          break;
        default:
          panic("decompile_maze: unknown data type (%i).",(ulong)(uint)(int)cVar2);
        }
        snprintf((char *)&local_b8,0x7f,__format,lVar14,"push",pcVar12);
LAB_0010dbf1:
        sVar7 = strlen((char *)&local_b8);
        sVar7 = write(iVar6,&local_b8,sVar7);
        sVar9 = strlen((char *)&local_b8);
        if (sVar7 != sVar9) break;
switchD_0010d931_caseD_0:
        lVar14 = lVar14 + 1;
      } while (lVar14 < lvl->n_opcodes);
    }
LAB_0010dc2a:
    close(iVar6);
    filename = local_100;
  }
  local_f8[0] = '\0';
  strcat(local_f8,outprefix);
  strcat(local_f8,filename);
  sVar7 = strlen(local_f8);
  auStack_f4[sVar7] = 0;
  builtin_strncpy(local_f8 + sVar7,".lev",4);
  iVar6 = open(local_f8,0x41,0x1a4);
  if (-1 < iVar6) {
    if (lvl == (sp_lev *)0x0) {
      panic("write_level_file");
    }
    if (be_verbose != 0) {
      fprintf(_stdout,"File: \'%s\', opcodes: %li\n",local_f8,lvl->n_opcodes);
    }
    sVar10 = write(iVar6,write_common_data_version_data,0xc);
    if (sVar10 == 0xc) {
      __buf = &lvl->n_opcodes;
      sVar10 = write(iVar6,__buf,8);
      if (sVar10 == 8) {
        if (0 < *__buf) {
          lVar15 = 0;
          lVar14 = 0;
          do {
            puVar1 = (ulong *)((long)&lvl->opcodes->opcode + lVar15);
            local_b8 = *puVar1;
            pbStack_b0 = (byte *)puVar1[1];
            sVar10 = write(iVar6,&local_b8,4);
            pbVar5 = pbStack_b0;
            if (sVar10 != 4) {
              return '\0';
            }
            if (0x4b < (uint)local_b8) {
              panic("write_maze: unknown opcode (%i).",local_b8 & 0xffffffff);
            }
            if ((uint)local_b8 == 0x28) {
              if (pbStack_b0 == (byte *)0x0) {
                panic("write_maze: PUSH with no data.");
              }
              sVar10 = write(iVar6,pbStack_b0,1);
              if (sVar10 != 1) {
                return '\0';
              }
              bVar3 = *pbVar5;
              if (8 < bVar3) {
                pcVar12 = "write_maze: unknown data type (%i).";
                uVar16 = (int)(char)bVar3;
LAB_0010dde7:
                panic(pcVar12,(ulong)uVar16);
              }
              if ((0x1f2U >> (bVar3 & 0x1f) & 1) == 0) {
                if ((0xcU >> (bVar3 & 0x1f) & 1) != 0) {
                  if (*(char **)(pbVar5 + 8) == (char *)0x0) {
                    iVar13 = 0;
                  }
                  else {
                    sVar7 = strlen(*(char **)(pbVar5 + 8));
                    iVar13 = (int)sVar7;
                  }
                  local_104 = iVar13;
                  sVar10 = write(iVar6,&local_104,4);
                  if (sVar10 != 4) {
                    return '\0';
                  }
                  if (iVar13 != 0) {
                    sVar7 = write(iVar6,*(void **)(pbVar5 + 8),(long)iVar13);
                    if (sVar7 != (long)iVar13) {
                      return '\0';
                    }
                    if (*(void **)(pbVar5 + 8) != (void *)0x0) {
                      free(*(void **)(pbVar5 + 8));
                    }
                  }
                }
              }
              else {
                sVar10 = write(iVar6,pbVar5 + 8,8);
                if (sVar10 != 8) {
                  return '\0';
                }
              }
            }
            else if (pbStack_b0 != (byte *)0x0) {
              pcVar12 = "write_maze: opcode (%i) has data.";
              uVar16 = (uint)local_b8;
              goto LAB_0010dde7;
            }
            if (pbStack_b0 != (byte *)0x0) {
              free(pbStack_b0);
            }
            lVar14 = lVar14 + 1;
            lVar15 = lVar15 + 0x10;
          } while (lVar14 < *__buf);
        }
        if (lvl->opcodes != (_opcode *)0x0) {
          free(lvl->opcodes);
        }
        lvl->opcodes = (_opcode *)0x0;
        close(iVar6);
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

boolean write_level_file(char *filename, sp_lev *lvl)
{
	int fout;
	char lbuf[60];

	if (decompile) {
	    lbuf[0] = '\0';
	    strcat(lbuf, outprefix);
	    strcat(lbuf, filename);
	    strcat(lbuf, "_lev.txt");
	    fout = open(lbuf, O_TRUNC|O_WRONLY|O_CREAT, OMASK);
	    if (fout < 0) return FALSE;
	    decompile_maze(fout, lvl);
	    close(fout);
	}

	lbuf[0] = '\0';
	strcat(lbuf, outprefix);
	strcat(lbuf, filename);
	strcat(lbuf, LEV_EXT);

	fout = open(lbuf, O_WRONLY|O_CREAT|O_BINARY, OMASK);
	if (fout < 0) return FALSE;

	if (!lvl) panic("write_level_file");

	if (be_verbose)
	    fprintf(stdout, "File: '%s', opcodes: %li\n", lbuf, lvl->n_opcodes);

	if (!write_maze(fout, lvl))
	    return FALSE;

	close(fout);

	return TRUE;
}